

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O1

void __thiscall cursespp::Window::Redraw(Window *this)

{
  bool bVar1;
  int iVar2;
  
  this->isDirty = true;
  iVar2 = (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x23])();
  if (((char)iVar2 != '\0') && (bVar1 = IsParentVisible(this), bVar1)) {
    if ((this->parent != (IWindow *)0x0) &&
       (iVar2 = (*(this->parent->super_IOrderable)._vptr_IOrderable[0x23])(), (char)iVar2 == '\0'))
    {
      return;
    }
    if (this->frame == (WINDOW *)0x0) {
      (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x2f])(this);
    }
    if (this->frame != (WINDOW *)0x0) {
      RepaintBackground(this);
      (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x35])(this);
      (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[4])(this);
      this->isDirty = false;
    }
  }
  return;
}

Assistant:

void Window::Redraw() {
    ASSERT_MAIN_THREAD();

    this->isDirty = true;

    if (this->IsVisible() && this->IsParentVisible()) {
        if (this->parent && !this->parent->IsVisible()) {
            return;
        }

        if (!this->frame) {
            this->Create();
        }

        if (this->frame) {
#if defined(__FreeBSD__) || (NCURSES_VERSION_PATCH >= 20200301)
            /* but depending on curses version we'll get redraw artifacts if we do or don't
            repaint the background. the changelog mentions changes to wbkgd() and wbkgrnd()
            at revision 20200301, but it's unclear if this is the actual root cause or not. */
            this->RepaintBackground();
#endif
            this->OnRedraw();
            this->Invalidate();
            this->isDirty = false;
            return;
        }
    }
}